

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void andres::marray_detail::
     OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::TimesEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
     ::operate(View<short,_false,_std::allocator<unsigned_long>_> *v,undefined8 x,size_t param_3)

{
  size_t sVar1;
  undefined8 local_30;
  size_t j;
  short *data_local;
  short *x_local;
  View<short,_false,_std::allocator<unsigned_long>_> *v_local;
  
  local_30 = 0;
  j = param_3;
  while( true ) {
    sVar1 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,3);
    if (sVar1 <= local_30) break;
    OperateHelperBinaryScalar<(unsigned_short)3,_andres::marray_detail::TimesEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
    ::operate(v,x,j);
    sVar1 = View<short,_false,_std::allocator<unsigned_long>_>::strides(v,3);
    j = sVar1 * 2 + j;
    local_30 = local_30 + 1;
  }
  View<short,_false,_std::allocator<unsigned_long>_>::shape(v,3);
  View<short,_false,_std::allocator<unsigned_long>_>::strides(v,3);
  return;
}

Assistant:

static inline void operate
    (
        View<T1, false, A>& v, 
        const T2& x, 
        Functor f, 
        T1* data
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperBinaryScalar<N-1, Functor, T1, T2, A>::operate(
                v, x, f, data);
            data += v.strides(N-1);
        }
        data -= v.shape(N-1) * v.strides(N-1);
    }